

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindCallableShader
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,char *pShaderGroupName,
          Uint32 CallableIndex,void *pData,Uint32 DataSize)

{
  uint uVar1;
  RenderDeviceVkImpl *pRVar2;
  bool bVar3;
  char (*Args_1) [61];
  ulong uVar4;
  ulong __new_size;
  long lVar5;
  string msg;
  string local_50;
  
  bVar3 = (DataSize != 0) != (pData == (void *)0x0);
  Args_1 = (char (*) [61])CONCAT71((int7)((ulong)pData >> 8),bVar3);
  if (!bVar3) {
    FormatString<char[26],char[38]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",(char (*) [38])Args_1);
    Args_1 = (char (*) [61])0x152;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
               "BindCallableShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x152);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((pData != (void *)0x0) && (this->m_ShaderRecordSize != DataSize)) {
    FormatString<char[26],char[61]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",Args_1)
    ;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
               "BindCallableShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x153);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pRVar2 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  lVar5 = (ulong)CallableIndex * (ulong)this->m_ShaderRecordStride;
  uVar4 = (long)(this->m_CallableShadersRecord).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_CallableShadersRecord).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = (ulong)this->m_ShaderRecordStride + lVar5;
  if (__new_size < uVar4) {
    __new_size = uVar4;
  }
  uVar1 = (pRVar2->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
          ShaderGroupHandleSize;
  local_50._M_dataplus._M_p._0_1_ = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_CallableShadersRecord,__new_size,(value_type_conflict4 *)&local_50);
  PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
            (&((this->m_pPSO).m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
             pShaderGroupName,
             (this->m_CallableShadersRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5,(ulong)this->m_ShaderRecordStride);
  memcpy((this->m_CallableShadersRecord).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + (ulong)uVar1 + lVar5,pData,(ulong)DataSize);
  this->m_Changed = true;
  return;
}

Assistant:

BindCallableShader(const char* pShaderGroupName,
                                               Uint32      CallableIndex,
                                               const void* pData,
                                               Uint32      DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));

        const Uint32 GroupSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Offset    = size_t{CallableIndex} * size_t{this->m_ShaderRecordStride};
        this->m_CallableShadersRecord.resize(std::max(this->m_CallableShadersRecord.size(), Offset + this->m_ShaderRecordStride), Uint8{EmptyElem});

        this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_CallableShadersRecord.data() + Offset, this->m_ShaderRecordStride);
        std::memcpy(this->m_CallableShadersRecord.data() + Offset + GroupSize, pData, DataSize);
        this->m_Changed = true;
    }